

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

bool __thiscall libcellml::Component::removeReset(Component *this,ResetPtr *reset)

{
  bool bVar1;
  ComponentImpl *pCVar2;
  __shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  ResetImpl *this_02;
  __normal_iterator<std::shared_ptr<libcellml::Reset>_*,_std::vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>_>
  local_30;
  __normal_iterator<const_std::shared_ptr<libcellml::Reset>_*,_std::vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>_>
  local_28;
  const_iterator result;
  ResetPtr *reset_local;
  Component *this_local;
  
  result._M_current = reset;
  pCVar2 = pFunc(this);
  local_28._M_current =
       (shared_ptr<libcellml::Reset> *)ComponentImpl::findReset(pCVar2,result._M_current);
  pCVar2 = pFunc(this);
  local_30._M_current =
       (shared_ptr<libcellml::Reset> *)
       std::
       vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
       ::end(&pCVar2->mResets);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
  if (bVar1) {
    this_00 = (__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<const_std::shared_ptr<libcellml::Reset>_*,_std::vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>_>
              ::operator*(&local_28);
    this_01 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_00);
    this_02 = Reset::pFunc(this_01);
    ParentedEntity::ParentedEntityImpl::removeParent(&this_02->super_ParentedEntityImpl);
    pCVar2 = pFunc(this);
    std::
    vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>::
    erase(&pCVar2->mResets,(const_iterator)local_28._M_current);
  }
  return bVar1;
}

Assistant:

bool Component::removeReset(const ResetPtr &reset)
{
    auto result = pFunc()->findReset(reset);
    if (result != pFunc()->mResets.end()) {
        (*result)->pFunc()->removeParent();
        pFunc()->mResets.erase(result);
        return true;
    }
    return false;
}